

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGen.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
RandomGen::VonNeumann
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,RandomGen *this,
          double xMin,double xMax,double yMin,double yMax,double xTest,double yTest,double fValue)

{
  long lVar1;
  ulong uVar2;
  RandomGen *pRVar3;
  pointer pdVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pdVar4 = (pointer)operator_new(0x18);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = pdVar4;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = pdVar4;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = pdVar4 + 3;
  *pdVar4 = 0.0;
  pdVar4[1] = 0.0;
  pdVar4[2] = 0.0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = pdVar4 + 3;
  *pdVar4 = xTest;
  pdVar4[1] = yTest;
  dVar6 = 0.0;
  if (fValue < yTest) {
    if (m_pInstance == (RandomGen *)0x0) {
      m_pInstance = (RandomGen *)operator_new(0x18);
      (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_ =
           0xc1f651c67c62c6e0;
      (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_ =
           0x30d89576f866ac9f;
      m_pInstance->rng_locked = false;
    }
    pRVar3 = m_pInstance;
    uVar2 = (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_;
    uVar5 = (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_;
    lVar1 = uVar5 + uVar2;
    uVar5 = uVar5 ^ uVar2;
    (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_ =
         uVar5 << 0x10 ^ (uVar2 << 0x18 | uVar2 >> 0x28) ^ uVar5;
    (pRVar3->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_ =
         uVar5 << 0x25 | uVar5 >> 0x1b;
    auVar7._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar7._0_8_ = lVar1;
    auVar7._12_4_ = 0x45300000;
    *pdVar4 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
              5.421010862427522e-20 * (xMax - xMin) + xMin;
    pRVar3 = m_pInstance;
    uVar2 = (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_;
    uVar5 = (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_;
    lVar1 = uVar5 + uVar2;
    uVar5 = uVar5 ^ uVar2;
    (m_pInstance->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_ =
         uVar5 << 0x10 ^ (uVar2 << 0x18 | uVar2 >> 0x28) ^ uVar5;
    (pRVar3->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_ =
         uVar5 << 0x25 | uVar5 >> 0x1b;
    auVar8._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar8._0_8_ = lVar1;
    auVar8._12_4_ = 0x45300000;
    pdVar4[1] = ((auVar8._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
                5.421010862427522e-20 * (yMax - yMin) + yMin;
    dVar6 = 1.0;
  }
  pdVar4[2] = dVar6;
  return __return_storage_ptr__;
}

Assistant:

vector<double> RandomGen::VonNeumann(double xMin, double xMax, double yMin,
                                     double yMax, double xTest, double yTest,
                                     double fValue) {
  vector<double> xyTry(3);

  xyTry[0] = xTest;
  xyTry[1] = yTest;

  if (xyTry[1] > fValue) {
    xyTry[0] = xMin + (xMax - xMin) * RandomGen::rndm()->rand_uniform();
    xyTry[1] = yMin + (yMax - yMin) * RandomGen::rndm()->rand_uniform();
    xyTry[2] = 1.;
  } else
    xyTry[2] = 0.;

  return xyTry;  // doing a vector means you can return 2 values at the same
                 // time
}